

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
::run(QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
      *this,QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_target_put_count)

{
  ostream *poVar1;
  size_t i_max_size;
  size_t i_max_size_00;
  size_t i_max_size_01;
  ScopedLeakCheck objecty_leak_check;
  
  poVar1 = std::operator<<(*(ostream **)this,"starting queue generic test with ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," threads and ");
  poVar1 = std::ostream::_M_insert<unsigned_long>(*(ulong *)this);
  std::operator<<(poVar1," total puts");
  poVar1 = std::operator<<(*(ostream **)this,"\nheterogeneous_queue: ");
  truncated_type_name<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
            ((string *)&objecty_leak_check,(density_tests *)0x50,i_max_size);
  std::operator<<(poVar1,(string *)&objecty_leak_check);
  std::__cxx11::string::~string((string *)&objecty_leak_check);
  poVar1 = std::operator<<(*(ostream **)this,"\nruntime_type: ");
  truncated_type_name<density::runtime_type<>>
            ((string *)&objecty_leak_check,(density_tests *)0x50,i_max_size_00);
  std::operator<<(poVar1,(string *)&objecty_leak_check);
  std::__cxx11::string::~string((string *)&objecty_leak_check);
  poVar1 = std::operator<<(*(ostream **)this,"\nallocator_type: ");
  truncated_type_name<density::basic_default_allocator<65536ul>>
            ((string *)&objecty_leak_check,(density_tests *)0x50,i_max_size_01);
  std::operator<<(poVar1,(string *)&objecty_leak_check);
  std::__cxx11::string::~string((string *)&objecty_leak_check);
  poVar1 = std::operator<<(*(ostream **)this,"\npage_alignment: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(*(ostream **)this,"\npage_size: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(*(ostream **)this,"\nconc puts: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\t\t\tconc consume: ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(*(ostream **)this,"\nconc put-consumes: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,"\t\t\tis_seq_cst: ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(*(ostream **)this,"\nwith_exceptions: ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(*(ostream **)this);
  InstanceCounted::ScopedLeakCheck::ScopedLeakCheck(&objecty_leak_check);
  run_impl(this,i_flags,i_random,i_target_put_count);
  poVar1 = std::operator<<(*(ostream **)this,"--------------------------------------------\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  InstanceCounted::ScopedLeakCheck::~ScopedLeakCheck(&objecty_leak_check);
  return;
}

Assistant:

void run(QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_target_put_count) const
        {
            bool const with_exceptions =
              (i_flags & QueueTesterFlags::eTestExceptions) != QueueTesterFlags::eNone;

            m_output << "starting queue generic test with " << m_thread_count << " threads and ";
            m_output << i_target_put_count << " total puts";
            m_output << "\nheterogeneous_queue: " << truncated_type_name<QUEUE>();
            m_output << "\nruntime_type: " << truncated_type_name<typename QUEUE::runtime_type>();
            m_output << "\nallocator_type: "
                     << truncated_type_name<typename QUEUE::allocator_type>();
            m_output << "\npage_alignment: " << QUEUE::allocator_type::page_alignment;
            m_output << "\npage_size: " << QUEUE::allocator_type::page_size;
            m_output << "\nconc puts: " << QUEUE::concurrent_puts
                     << "\t\t\tconc consume: " << QUEUE::concurrent_consumes;
            m_output << "\nconc put-consumes: " << QUEUE::concurrent_put_consumes
                     << "\t\t\tis_seq_cst: " << QUEUE::is_seq_cst;
            m_output << "\nwith_exceptions: " << with_exceptions;
            m_output << std::endl;

            InstanceCounted::ScopedLeakCheck objecty_leak_check;
            run_impl(i_flags, i_random, i_target_put_count);

            m_output << "--------------------------------------------\n" << std::endl;
        }